

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall cppcms::json::value::load(value *this,istream *in,bool full,int *line_number)

{
  bool bVar1;
  undefined4 *in_RCX;
  int err_line;
  int *in_stack_00000500;
  bool in_stack_0000050f;
  value *in_stack_00000510;
  istream *in_stack_00000518;
  undefined4 local_2c;
  undefined1 local_1;
  
  bVar1 = anon_unknown_9::parse_stream
                    (in_stack_00000518,in_stack_00000510,in_stack_0000050f,in_stack_00000500);
  if (bVar1) {
    local_1 = true;
  }
  else {
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = local_2c;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool value::load(std::istream &in,bool full,int *line_number)
	{
		int err_line;
		if(!parse_stream(in,*this,full,err_line)) {
			if(line_number)
				*line_number=err_line;
			return false;
		}
		return true;

	}